

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode parse_connect_to_slist(Curl_easy *data,connectdata *conn,curl_slist *conn_to_host)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  uint local_3c;
  _Bool ipv6host;
  char *pcStack_38;
  int port;
  char *host;
  curl_slist *pcStack_28;
  CURLcode result;
  curl_slist *conn_to_host_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  host._4_4_ = CURLE_OK;
  pcStack_38 = (char *)0x0;
  local_3c = 0;
  pcStack_28 = conn_to_host;
  conn_to_host_local = (curl_slist *)conn;
  conn_local = (connectdata *)data;
  while( true ) {
    if (pcStack_28 == (curl_slist *)0x0 || pcStack_38 != (char *)0x0) {
      return host._4_4_;
    }
    host._4_4_ = parse_connect_to_string
                           ((Curl_easy *)conn_local,(connectdata *)conn_to_host_local,
                            pcStack_28->data,&stack0xffffffffffffffc8,(int *)&local_3c);
    if (host._4_4_ != CURLE_OK) break;
    if ((pcStack_38 == (char *)0x0) || (*pcStack_38 == '\0')) {
      *(undefined1 *)((long)&conn_to_host_local[0x2f].data + 3) = 0;
      (*Curl_cfree)(pcStack_38);
    }
    else {
      conn_to_host_local[0xd].data = pcStack_38;
      conn_to_host_local[0xe].data = pcStack_38;
      *(undefined1 *)((long)&conn_to_host_local[0x2f].data + 3) = 1;
      pcVar1 = strchr(pcStack_38,0x3a);
      pcVar2 = "";
      if (pcVar1 != (char *)0x0) {
        pcVar2 = "[";
      }
      pcVar3 = "";
      if (pcVar1 != (char *)0x0) {
        pcVar3 = "]";
      }
      Curl_infof((Curl_easy *)conn_local,"Connecting to hostname: %s%s%s\n",pcVar2,pcStack_38,pcVar3
                );
    }
    if ((int)local_3c < 0) {
      *(undefined1 *)((long)&conn_to_host_local[0x2f].data + 4) = 0;
    }
    else {
      *(uint *)((long)&conn_to_host_local[0x11].next + 4) = local_3c;
      *(undefined1 *)((long)&conn_to_host_local[0x2f].data + 4) = 1;
      Curl_infof((Curl_easy *)conn_local,"Connecting to port: %d\n",(ulong)local_3c);
    }
    pcStack_28 = pcStack_28->next;
  }
  return host._4_4_;
}

Assistant:

static CURLcode parse_connect_to_slist(struct Curl_easy *data,
                                       struct connectdata *conn,
                                       struct curl_slist *conn_to_host)
{
  CURLcode result = CURLE_OK;
  char *host = NULL;
  int port = 0;

  while(conn_to_host && !host) {
    result = parse_connect_to_string(data, conn, conn_to_host->data,
                                     &host, &port);
    if(result)
      return result;

    if(host && *host) {
      bool ipv6host;
      conn->conn_to_host.rawalloc = host;
      conn->conn_to_host.name = host;
      conn->bits.conn_to_host = TRUE;

      ipv6host = strchr(host, ':') != NULL;
      infof(data, "Connecting to hostname: %s%s%s\n",
            ipv6host ? "[" : "", host, ipv6host ? "]" : "");
    }
    else {
      /* no "connect to host" */
      conn->bits.conn_to_host = FALSE;
      free(host);
    }

    if(port >= 0) {
      conn->conn_to_port = port;
      conn->bits.conn_to_port = TRUE;
      infof(data, "Connecting to port: %d\n", port);
    }
    else {
      /* no "connect to port" */
      conn->bits.conn_to_port = FALSE;
    }

    conn_to_host = conn_to_host->next;
  }

  return result;
}